

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

uint aom_variance128x64_avx2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint *sse)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i vsse_00;
  long lVar3;
  uint *extraout_RDX;
  undefined4 in_register_00000034;
  ulong uVar4;
  int iVar5;
  uint8_t *ref_00;
  bool bVar6;
  undefined1 auVar7 [64];
  __m128i vsum;
  __m256i vsum16;
  __m256i vsse;
  __m256i *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar4 = CONCAT44(in_register_00000034,src_stride);
  auVar7 = ZEXT1664((undefined1  [16])0x0);
  local_a0 = auVar7._0_32_;
  lVar3 = (long)(src_stride << 4);
  iVar5 = 4;
  ref_00 = ref;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    uVar4 = (ulong)(uint)src_stride;
    local_80 = auVar7._0_32_;
    variance128_avx2(src,src_stride,ref_00,ref_stride,(int)local_a0,(__m256i *)local_c0,
                     in_stack_ffffffffffffff20);
    auVar1 = vpmovsxwd_avx2(local_c0);
    auVar2 = vpmovsxwd_avx2(local_b0);
    auVar1 = vpaddd_avx2(auVar1,local_80);
    auVar1 = vpaddd_avx2(auVar1,auVar2);
    auVar7 = ZEXT3264(auVar1);
    src = src + lVar3;
    ref_00 = ref_00 + (ref_stride << 4);
    ref = (uint8_t *)extraout_RDX;
  }
  vpaddd_avx(auVar7._16_16_,auVar7._0_16_);
  vsse_00[1]._0_4_ = in_stack_ffffffffffffff28;
  vsse_00[0] = (longlong)in_stack_ffffffffffffff20;
  vsse_00[1]._4_4_ = src_stride;
  vsse_00[2] = (longlong)sse;
  vsse_00[3] = lVar3;
  vsum[1] = uVar4;
  vsum[0] = (longlong)sse;
  iVar5 = variance_final_from_32bit_sum_avx2(vsse_00,vsum,(uint *)ref);
  return *sse - (int)((ulong)((long)iVar5 * (long)iVar5) >> 0xd);
}

Assistant:

unsigned int aom_mse16x16_avx2(const uint8_t *src, int src_stride,
                               const uint8_t *ref, int ref_stride,
                               unsigned int *sse) {
  aom_variance16x16_avx2(src, src_stride, ref, ref_stride, sse);
  return *sse;
}